

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::sse2::BVH4BuilderTwoLevelTriangle4iMeshSAH
                    (void *bvh,Scene *scene,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *this;
  
  this = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_> *)
         ::operator_new(0xa8);
  BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,MTY_TRIANGLE_MESH,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH4BuilderTwoLevelTriangle4iMeshSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<4,TriangleMesh,Triangle4i>((BVH4*)bvh,scene,TriangleMesh::geom_type,useMortonBuilder);
    }